

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O2

void __thiscall
Variation::canonify(Variation *this,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
                   *references,bool rightmost)

{
  node_pointer ppVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1b0 [32];
  ostringstream oss;
  
  ppVar1 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find_node((table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)references,(const_key_type *)(this + 8));
  if (ppVar1 != (node_pointer)0x0) {
    canonify(this,*(NamedDnaSequence **)(ppVar1 + 0x30),rightmost);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Cannot find reference ");
  std::operator<<(poVar2,(string *)(this + 8));
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Variation::canonify(const boost::unordered_map<std::string,NamedDnaSequence*>& references, bool rightmost) {
	typedef boost::unordered_map<string,NamedDnaSequence*>::const_iterator references_it_t;
	references_it_t it = references.find(chromosome);
	if (it == references.end()) {
		ostringstream oss;
		oss << "Cannot find reference " << chromosome;
		throw runtime_error(oss.str());
	}
	canonify(it->second, rightmost);
}